

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

_Bool ggml_is_contiguous_n(ggml_tensor *tensor,int n)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  _Bool _Var5;
  
  if ((tensor->ne[0] == type_traits[tensor->type].blck_size) ||
     (tensor->nb[0] == type_traits[tensor->type].type_size)) {
    sVar3 = (tensor->ne[0] / type_traits[tensor->type].blck_size) *
            type_traits[tensor->type].type_size;
    lVar1 = 0;
    while (lVar4 = lVar1, _Var5 = lVar4 == 3, !_Var5) {
      lVar1 = lVar4 + 1;
      lVar2 = tensor->ne[lVar4 + 1];
      if (lVar2 != 1) {
        if (n < lVar1) {
          if (tensor->nb[lVar4 + 1] != sVar3) {
            return _Var5;
          }
          sVar3 = sVar3 * lVar2;
        }
        else {
          sVar3 = tensor->nb[lVar4 + 1] * lVar2;
        }
      }
    }
  }
  else {
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

static bool ggml_is_contiguous_n(const struct ggml_tensor * tensor, int n) {
    size_t next_nb = ggml_type_size(tensor->type);
    if (tensor->ne[0] != ggml_blck_size(tensor->type) && tensor->nb[0] != next_nb) {
        return false;
    }
    next_nb *= tensor->ne[0]/ggml_blck_size(tensor->type);
    for (int i = 1; i < GGML_MAX_DIMS; i++) {
        if (tensor->ne[i] != 1) {
            if (i > n) {
                if (tensor->nb[i] != next_nb) {
                    return false;
                }
                next_nb *= tensor->ne[i];
            } else {
                // this dimension does not need to be contiguous
                next_nb = tensor->ne[i]*tensor->nb[i];
            }
        }
    }
    return true;
}